

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O3

void __thiscall gdsForge::GDSwriteUnits(gdsForge *this)

{
  undefined8 local_18;
  undefined8 uStack_10;
  undefined4 local_8;
  
  local_18 = 0x3789413e05031400;
  uStack_10 = 0x2fb84439f0a7c64b;
  local_8 = 0x505a9ba0;
  fwrite(&local_18,1,0x14,(FILE *)this->gdsFile);
  return;
}

Assistant:

void gdsForge::GDSwriteUnits()
{
  unsigned char data[20];

  data[0] = 0x00;
  data[1] = 0x14;
  data[2] = 0x03;
  data[3] = 0x05;
  data[4] = 0x3e;
  data[5] = 0x41;
  data[6] = 0x89;
  data[7] = 0x37;
  data[8] = 0x4b;
  data[9] = 0xc6;
  data[10] = 0xa7;
  data[11] = 0xf0;
  data[12] = 0x39;
  data[13] = 0x44;
  data[14] = 0xb8;
  data[15] = 0x2f;
  data[16] = 0xa0;
  data[17] = 0x9b;
  data[18] = 0x5a;
  data[19] = 0x50;

  fwrite(data, 1, 20, this->gdsFile);
}